

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O2

void __thiscall
PoolList<Future<void>::Private::ThreadPool::ThreadContext>::~PoolList
          (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *pIVar2;
  PoolList<Future<void>::Private::ThreadPool::ThreadContext> *pPVar3;
  
  pPVar3 = this;
  while (pPVar3 = (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *)
                  (pPVar3->_begin).item,
        pPVar3 != (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *)&this->endItem) {
    Thread::~Thread((Thread *)&pPVar3->_size);
  }
  pIVar2 = this->blocks;
  while (pIVar2 != (ItemBlock *)0x0) {
    pIVar1 = pIVar2->next;
    operator_delete__(pIVar2);
    pIVar2 = pIVar1;
  }
  return;
}

Assistant:

~PoolList()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      ((T*)(i + 1))->~T();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }